

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_bfs.cpp
# Opt level: O2

void __thiscall
ParallelBFS::ParallelBFS(ParallelBFS *this,communicator *comm,NodeList *vertices,NodeList *edges)

{
  pointer piVar1;
  pointer piVar2;
  ParallelBFS *this_00;
  NodeList *this_01;
  NodeList *this_02;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  allocator_type local_ed;
  int local_ec;
  ParallelBFS *local_e8;
  NodeList *local_e0;
  NodeList *local_d8;
  NodeList *local_d0;
  NodeList *local_c8;
  NodeList description;
  NodeList all_description;
  NodeList first_edges;
  NodeList part_edges;
  NodeList first_vertices;
  NodeList part_vertices;
  
  this->comm = comm;
  local_d8 = &this->vertices;
  local_e0 = &this->edges;
  (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->edges).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->distance).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->edges).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->edges).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->distance).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->distance).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  piVar1 = (vertices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  piVar2 = (vertices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  local_e8 = this;
  local_d0 = edges;
  iVar3 = boost::mpi::communicator::size();
  uVar8 = (ulong)((long)piVar2 - (long)piVar1) >> 2;
  local_ec = (int)((long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) /
                  (long)iVar3);
  piVar1 = (vertices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  piVar2 = (vertices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  iVar4 = boost::mpi::communicator::size();
  uVar8 = (ulong)((long)piVar2 - (long)piVar1) >> 2;
  iVar3 = boost::mpi::communicator::size();
  std::vector<int,_std::allocator<int>_>::vector
            (&part_vertices,(long)iVar3,(allocator_type *)&first_vertices);
  iVar3 = boost::mpi::communicator::size();
  std::vector<int,_std::allocator<int>_>::vector
            (&first_vertices,(long)iVar3,(allocator_type *)&part_edges);
  iVar3 = boost::mpi::communicator::size();
  std::vector<int,_std::allocator<int>_>::vector
            (&part_edges,(long)iVar3,(allocator_type *)&first_edges);
  iVar3 = boost::mpi::communicator::size();
  std::vector<int,_std::allocator<int>_>::vector
            (&first_edges,(long)iVar3,(allocator_type *)&all_description);
  local_c8 = vertices;
  iVar3 = boost::mpi::communicator::size();
  std::vector<int,_std::allocator<int>_>::vector
            (&all_description,(long)(iVar3 << 2),(allocator_type *)&description);
  lVar13 = 0;
  lVar10 = 0;
  iVar3 = 0;
  iVar11 = 0;
  while( true ) {
    iVar5 = boost::mpi::communicator::size();
    if (iVar5 <= lVar10) break;
    iVar6 = (uint)(lVar10 < (int)((long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 |
                                        uVar8 & 0xffffffff) % (long)iVar4)) + local_ec;
    iVar5 = iVar6 + iVar3;
    piVar1 = (local_c8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = (long)(local_c8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar1 >> 2;
    if (lVar9 == iVar5) {
      iVar7 = (int)((ulong)((long)(local_d0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)(local_d0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start) >> 2);
    }
    else {
      iVar7 = piVar1[iVar5];
    }
    iVar12 = (int)lVar13;
    all_description.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar12] = (int)lVar9;
    *(int *)((long)first_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar13) = iVar3;
    all_description.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar12 + 1] = iVar3;
    *(int *)((long)part_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar13) = iVar6;
    all_description.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar12 + 2] = iVar6;
    *(int *)((long)part_edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar13) = iVar7 - iVar11;
    all_description.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar12 + 3] = iVar7 - iVar11;
    *(int *)((long)first_edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar13) = iVar11;
    lVar10 = lVar10 + 1;
    lVar13 = lVar13 + 4;
    iVar3 = iVar5;
    iVar11 = iVar7;
  }
  std::vector<int,_std::allocator<int>_>::vector(&description,4,&local_ed);
  this_02 = local_d8;
  this_01 = local_e0;
  this_00 = local_e8;
  boost::mpi::detail::scatter_impl<int>
            (comm,all_description.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
             description.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,4,0);
  this_00->vertex_total_count =
       *description.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start;
  this_00->first_vertex =
       description.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start[1];
  std::vector<int,_std::allocator<int>_>::resize
            (this_02,(long)description.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[2]);
  boost::mpi::scatterv<int>(comm,local_c8,&part_vertices,&first_vertices,this_02,0);
  std::vector<int,_std::allocator<int>_>::resize
            (this_01,(long)description.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[3]);
  boost::mpi::scatterv<int>(comm,local_d0,&part_edges,&first_edges,this_01,0);
  prepare(this_00);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&description.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&all_description.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&first_edges.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&part_edges.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&first_vertices.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&part_vertices.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

ParallelBFS::ParallelBFS(const mpi::communicator &comm,
                         const NodeList &vertices,
                         const NodeList &edges) :
    comm(comm) {
  NodeId part = (NodeId)vertices.size() / comm.size(),
      left_vertices = (NodeId)vertices.size() % comm.size(),
      first_vertex = 0, first_edge = 0;
  NodeList part_vertices((size_t)comm.size());
  NodeList first_vertices((size_t)comm.size());
  NodeList part_edges((size_t)comm.size());
  NodeList first_edges((size_t)comm.size());
  NodeList all_description((size_t)(comm.size() << 2));
  for (int i = 0; i < comm.size(); ++i) {
    NodeId this_part = part + (i < left_vertices);
    NodeId last_edge = first_vertex + this_part == vertices.size() ?
                      (NodeId)edges.size() :
                      vertices[first_vertex + this_part];
    all_description[(i<<2)] = (NodeId)vertices.size();
    all_description[(i<<2) + 1] = first_vertices[i] = first_vertex;
    all_description[(i<<2) + 2] = part_vertices[i] = this_part;
    all_description[(i<<2) + 3] = part_edges[i] = last_edge - first_edge;
    first_edges[i] = first_edge;
    first_edge = last_edge;
    first_vertex += this_part;
  }
  NodeList description(4);
  mpi::scatter(comm, all_description.data(), description.data(), 4, 0);
  this->vertex_total_count = description[0];
  this->first_vertex = description[1];
  this->vertices.resize((size_t)description[2]);
  mpi::scatterv(comm, vertices, part_vertices, first_vertices,
                this->vertices, 0);
  this->edges.resize((size_t)description[3]);
  mpi::scatterv(comm, edges, part_edges, first_edges,
                this->edges, 0);
  prepare();
}